

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

int SSL_peek(SSL *ssl,void *buf,int num)

{
  void *dst;
  int iVar1;
  unsigned_long *puVar2;
  uchar *src;
  unsigned_long local_40;
  size_t local_38;
  size_t local_30;
  size_t todo;
  int ret;
  int num_local;
  void *buf_local;
  SSL *ssl_local;
  
  todo._4_4_ = num;
  _ret = buf;
  buf_local = ssl;
  iVar1 = SSL_is_quic((SSL *)ssl);
  if (iVar1 == 0) {
    todo._0_4_ = ssl_read_impl((SSL *)buf_local);
    ssl_local._4_4_ = (int)todo;
    if (0 < (int)todo) {
      if (todo._4_4_ < 1) {
        ssl_local._4_4_ = todo._4_4_;
      }
      else {
        local_38 = bssl::Span<unsigned_char>::size
                             ((Span<unsigned_char> *)(*(long *)((long)buf_local + 0x30) + 0x80));
        local_40 = (unsigned_long)todo._4_4_;
        puVar2 = std::min<unsigned_long>(&local_38,&local_40);
        dst = _ret;
        local_30 = *puVar2;
        src = bssl::Span<unsigned_char>::data
                        ((Span<unsigned_char> *)(*(long *)((long)buf_local + 0x30) + 0x80));
        OPENSSL_memcpy(dst,src,local_30);
        ssl_local._4_4_ = (int)local_30;
      }
    }
  }
  else {
    ERR_put_error(0x10,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                  ,0x39d);
    ssl_local._4_4_ = -1;
  }
  return ssl_local._4_4_;
}

Assistant:

int SSL_peek(SSL *ssl, void *buf, int num) {
  if (SSL_is_quic(ssl)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return -1;
  }

  int ret = ssl_read_impl(ssl);
  if (ret <= 0) {
    return ret;
  }
  if (num <= 0) {
    return num;
  }
  size_t todo =
      std::min(ssl->s3->pending_app_data.size(), static_cast<size_t>(num));
  OPENSSL_memcpy(buf, ssl->s3->pending_app_data.data(), todo);
  return static_cast<int>(todo);
}